

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::LoadGetStateBlock_w
          (ChLoadContactSurfaceMesh *this,ChStateDelta *mD)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  pointer psVar4;
  ulong uVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  
  psVar4 = (this->forces).
           super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->forces).
      super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    lVar8 = 0;
    uVar5 = 0;
    iVar6 = 0;
    do {
      lVar1 = *(long *)((long)&(psVar4->
                               super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      plVar7 = *(long **)(lVar1 + 0x58);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)((long)plVar7 + *(long *)(*plVar7 + -0x78));
      }
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x60);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (**(code **)(*plVar7 + 0x28))(plVar7,iVar6,mD);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      lVar1 = *(long *)((long)&(((this->forces).
                                 super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
      plVar7 = *(long **)(lVar1 + 0x58);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)((long)plVar7 + *(long *)(*plVar7 + -0x78));
      }
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x60);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar3 = (**(code **)(*plVar7 + 0x18))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar4 = (this->forces).
               super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = iVar6 + iVar3;
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar5 < (ulong)((long)(this->forces).
                                   super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  return;
}

Assistant:

void ChLoadContactSurfaceMesh::LoadGetStateBlock_w(ChStateDelta& mD) {
    int ndoftot = 0;
    for (int i = 0; i < forces.size(); ++i) {
        forces[i]->loader.GetLoadable()->LoadableGetStateBlock_w(ndoftot, mD);
        ndoftot += forces[i]->loader.GetLoadable()->LoadableGet_ndof_w();
    }
}